

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_requirement.cpp
# Opt level: O3

void __thiscall
ImportRequirement_requirementsRepeatedImports_Test::
~ImportRequirement_requirementsRepeatedImports_Test
          (ImportRequirement_requirementsRepeatedImports_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ImportRequirement, requirementsRepeatedImports)
{
    const std::vector<std::string> e = {
        "importExample2components.cellml",
        "importExample2units.cellml",
    };

    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("import-requirements/importExample2.cellml"));

    auto requirements = model->importRequirements();
    EXPECT_EQ(e, requirements);
}